

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

Ga2_Man_t * Ga2_ManStart(Gia_Man_t *pGia,Abs_Par_t *pPars)

{
  int iVar1;
  Ga2_Man_t *p_00;
  abctime aVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pObj;
  Rnm_Man_t *pRVar5;
  int *piVar6;
  Ga2_Man_t *p;
  Abs_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  p_00 = (Ga2_Man_t *)calloc(1,0xe0);
  aVar2 = Abc_Clock();
  p_00->timeStart = aVar2;
  p_00->fUseNewLine = 1;
  p_00->pGia = pGia;
  p_00->pPars = pPars;
  iVar1 = Ga2_ManMarkup(pGia,5,pPars->fUseSimple);
  p_00->nMarked = iVar1;
  pVVar3 = Vec_PtrAlloc(1000);
  p_00->vCnfs = pVVar3;
  pVVar3 = p_00->vCnfs;
  pVVar4 = Vec_IntAlloc(0);
  Vec_PtrPush(pVVar3,pVVar4);
  pVVar3 = p_00->vCnfs;
  pVVar4 = Vec_IntAlloc(0);
  Vec_PtrPush(pVVar3,pVVar4);
  iVar1 = Gia_ManObjNum(pGia);
  pVVar4 = Vec_IntStartFull(iVar1);
  p_00->vIds = pVVar4;
  pVVar4 = Vec_IntAlloc(0);
  p_00->vProofIds = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  p_00->vAbs = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  p_00->vValues = pVVar4;
  pObj = Gia_ManConst0(pGia);
  Ga2_ObjSetId(p_00,pObj,0);
  Vec_IntPush(p_00->vValues,0);
  Vec_IntPush(p_00->vAbs,0);
  pRVar5 = Rnm_ManStart(pGia);
  p_00->pRnm = pRVar5;
  pVVar3 = Vec_PtrAlloc(1000);
  p_00->vId2Lit = pVVar3;
  pVVar4 = Vec_IntAlloc(100);
  p_00->vLits = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  p_00->vIsopMem = pVVar4;
  Cnf_ReadMsops(&p_00->pSopSizes,&p_00->pSops);
  iVar1 = Abc_PrimeCudd(0x40000);
  p_00->nTable = iVar1;
  piVar6 = (int *)calloc((long)(p_00->nTable * 6),4);
  p_00->pTable = piVar6;
  return p_00;
}

Assistant:

Ga2_Man_t * Ga2_ManStart( Gia_Man_t * pGia, Abs_Par_t * pPars )
{
    Ga2_Man_t * p;
    p = ABC_CALLOC( Ga2_Man_t, 1 );
    p->timeStart = Abc_Clock();
    p->fUseNewLine = 1;
    // user data
    p->pGia      = pGia;
    p->pPars     = pPars;
    // markings 
    p->nMarked   = Ga2_ManMarkup( pGia, 5, pPars->fUseSimple );
    p->vCnfs     = Vec_PtrAlloc( 1000 );
    Vec_PtrPush( p->vCnfs, Vec_IntAlloc(0) );
    Vec_PtrPush( p->vCnfs, Vec_IntAlloc(0) );
    // abstraction
    p->vIds      = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vProofIds = Vec_IntAlloc( 0 );
    p->vAbs      = Vec_IntAlloc( 1000 );
    p->vValues   = Vec_IntAlloc( 1000 );
    // add constant node to abstraction
    Ga2_ObjSetId( p, Gia_ManConst0(pGia), 0 );
    Vec_IntPush( p->vValues, 0 );
    Vec_IntPush( p->vAbs, 0 );
    // refinement
    p->pRnm      = Rnm_ManStart( pGia );
//    p->pRf2      = Rf2_ManStart( pGia );
    // SAT solver and variables
    p->vId2Lit   = Vec_PtrAlloc( 1000 );
    // temporaries
    p->vLits     = Vec_IntAlloc( 100 );
    p->vIsopMem  = Vec_IntAlloc( 100 );
    Cnf_ReadMsops( &p->pSopSizes, &p->pSops );
    // hash table
    p->nTable = Abc_PrimeCudd(1<<18);
    p->pTable = ABC_CALLOC( int, 6 * p->nTable ); 
    return p;
}